

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

NameIndex * __thiscall
llvm::DWARFDebugNames::getCUNameIndex(DWARFDebugNames *this,uint64_t CUOffset)

{
  uint uVar1;
  uint32_t uVar2;
  size_t sVar3;
  NameIndex *pNVar4;
  pair<llvm::DenseMapIterator<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>,_false>,_bool>
  local_68;
  NameIndex *local_50;
  uint64_t local_48;
  uint local_3c;
  NameIndex *pNStack_38;
  uint32_t CU;
  NameIndex *NI;
  const_iterator __end2;
  const_iterator __begin2;
  DWARFDebugNames *__range2;
  uint64_t CUOffset_local;
  DWARFDebugNames *this_local;
  
  __range2 = (DWARFDebugNames *)CUOffset;
  CUOffset_local = (uint64_t)this;
  uVar1 = DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
          ::size((DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
                  *)&this->CUToNameIndex);
  if ((uVar1 == 0) &&
     (sVar3 = SmallVectorBase::size((SmallVectorBase *)&this->NameIndices), sVar3 != 0)) {
    __begin2 = (const_iterator)this;
    __end2 = begin(this);
    NI = end((DWARFDebugNames *)__begin2);
    for (; __end2 != NI; __end2 = __end2 + 1) {
      pNStack_38 = __end2;
      for (local_3c = 0; uVar1 = local_3c, uVar2 = NameIndex::getCUCount(pNStack_38), uVar1 < uVar2;
          local_3c = local_3c + 1) {
        local_48 = NameIndex::getCUOffset(pNStack_38,local_3c);
        local_50 = pNStack_38;
        DenseMapBase<llvm::DenseMap<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>,unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>
        ::try_emplace<llvm::DWARFDebugNames::NameIndex_const*>
                  (&local_68,
                   (DenseMapBase<llvm::DenseMap<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>,unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>
                    *)&this->CUToNameIndex,&local_48,&local_50);
      }
    }
  }
  pNVar4 = DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
           ::lookup((DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
                     *)&this->CUToNameIndex,(const_arg_type_t<unsigned_long>)&__range2);
  return pNVar4;
}

Assistant:

const DWARFDebugNames::NameIndex *
DWARFDebugNames::getCUNameIndex(uint64_t CUOffset) {
  if (CUToNameIndex.size() == 0 && NameIndices.size() > 0) {
    for (const auto &NI : *this) {
      for (uint32_t CU = 0; CU < NI.getCUCount(); ++CU)
        CUToNameIndex.try_emplace(NI.getCUOffset(CU), &NI);
    }
  }
  return CUToNameIndex.lookup(CUOffset);
}